

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool Js::FunctionProxy::SetDisplayName
               (char16 *srcName,WriteBarrierPtr<const_char16_t> *destName,uint displayNameLength,
               ScriptContext *scriptContext,SetDisplayNameFlags flags)

{
  WriteBarrierPtr<const_char16_t> WVar1;
  bool bVar2;
  WriteBarrierPtr<const_char16_t> local_28;
  char16 *dest;
  
  local_28.ptr = (char16_t *)0x0;
  bVar2 = SetDisplayName(srcName,&local_28.ptr,displayNameLength,scriptContext,flags);
  WVar1.ptr = local_28.ptr;
  if (bVar2) {
    Memory::Recycler::WBSetBit((char *)destName);
    destName->ptr = (char16_t *)WVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(destName);
  }
  else {
    destName->ptr = (char16_t *)local_28;
  }
  return bVar2;
}

Assistant:

bool FunctionProxy::SetDisplayName(const char16* srcName, WriteBarrierPtr<const char16>* destName, uint displayNameLength, ScriptContext * scriptContext, SetDisplayNameFlags flags /* default to None */)
    {
        const char16* dest = nullptr;
        bool targetIsRecyclerMemory = SetDisplayName(srcName, &dest, displayNameLength, scriptContext, flags);

        if (targetIsRecyclerMemory)
        {
            *destName = dest;
        }
        else
        {
            destName->NoWriteBarrierSet(dest);
        }
        return targetIsRecyclerMemory;
    }